

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void lj_record_setup(jit_State *J)

{
  TraceNo TVar1;
  ExitNo EVar2;
  uint uVar3;
  GCtrace *T_00;
  IRIns *pIVar4;
  BCIns *pBVar5;
  uint local_44;
  BCIns startins;
  TraceNo root;
  GCtrace *T;
  IRIns *ir;
  uint32_t i;
  jit_State *J_local;
  
  memset(J->slot,0,0x408);
  memset(J->chain,0,0xca);
  memset(J->bpropcache,0,0x80);
  (J->scev).idx = 0x7fff;
  (J->scev).pc.ptr64 = 0;
  J->baseslot = 2;
  J->base = J->slot + J->baseslot;
  J->maxslot = 0;
  J->framedepth = 0;
  J->retdepth = 0;
  J->instunroll = J->param[9];
  J->loopunroll = J->param[10];
  J->tailcalled = 0;
  J->loopref = 0;
  J->bc_min = (BCIns *)0x0;
  J->bc_extent = 0xffffffff;
  TVar1 = J->parent;
  EVar2 = J->exitno;
  (J->fold).ins.field_0.ot = 0xd09;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)EVar2;
  lj_ir_emit(J);
  for (ir._4_4_ = 0; ir._4_4_ < 3; ir._4_4_ = ir._4_4_ + 1) {
    pIVar4 = (J->cur).ir + (0x7fff - ir._4_4_);
    (pIVar4->field_1).op12 = 0;
    (pIVar4->field_1).t.irt = (uint8_t)ir._4_4_;
    (pIVar4->field_1).o = '\x16';
    (pIVar4->field_0).prev = 0;
  }
  (J->cur).nk = 0x7ffd;
  J->startpc = J->pc;
  (J->cur).startpc.ptr64 = (uint64_t)J->pc;
  if (J->parent == 0) {
    (J->cur).root = 0;
    (J->cur).startins = *J->pc;
    pBVar5 = rec_setup_root(J);
    J->pc = pBVar5;
    lj_snap_add(J);
    if (((J->cur).startins & 0xff) == 0x4f) {
      rec_for_loop(J,J->pc + -1,&J->scev,1);
    }
    else if (((J->cur).startins & 0xff) == 0x45) {
      J->startpc = (BCIns *)0x0;
    }
    if (0xf9 < J->pt->framesize + 1) {
      lj_trace_err(J,LJ_TRERR_STACKOV);
    }
    goto LAB_0019d317;
  }
  T_00 = (GCtrace *)J->trace[J->parent].gcptr64;
  if (T_00->root == 0) {
    local_44 = J->parent;
  }
  else {
    local_44 = (uint)T_00->root;
  }
  (J->cur).root = (TraceNo1)local_44;
  (J->cur).startins = 0x58;
  if ((J->exitno == 0) && (T_00->snap->nent == '\0')) {
    if ((((GCproto *)J->pc <= J->pt + 1) || ((J->pc[-1] & 0xff) != 0x4e)) ||
       (J->pc[(ulong)(J->pc[-1] >> 0x10) - 0x8001] >> 0x10 != local_44)) goto LAB_0019d16d;
    lj_snap_add(J);
    rec_for_loop(J,J->pc + -1,&J->scev,1);
  }
  else {
    J->startpc = (BCIns *)0x0;
LAB_0019d16d:
    lj_snap_replay(J,T_00);
  }
  if ((J->param[3] <= (int)(uint)*(ushort *)(J->trace[(J->cur).root].gcptr64 + 100)) ||
     (J->param[7] + J->param[8] <= (int)(uint)T_00->snap[J->exitno].count)) {
    if (((*J->pc & 0xff) == 0x57) &&
       (uVar3 = *(uint *)(J->trace[*J->pc >> 0x10].gcptr64 + 0x50), (uVar3 & 0xff) == 0x46)) {
      rec_itern(J,uVar3 >> 8 & 0xff,uVar3 >> 0x18);
    }
    lj_record_stop(J,LJ_TRLINK_INTERP,0);
  }
LAB_0019d317:
  J->prev_pt = (GCproto *)0x0;
  J->prev_line = -1;
  return;
}

Assistant:

void lj_record_setup(jit_State *J)
{
  uint32_t i;

  /* Initialize state related to current trace. */
  memset(J->slot, 0, sizeof(J->slot));
  memset(J->chain, 0, sizeof(J->chain));
#ifdef LUAJIT_ENABLE_TABLE_BUMP
  memset(J->rbchash, 0, sizeof(J->rbchash));
#endif
  memset(J->bpropcache, 0, sizeof(J->bpropcache));
  J->scev.idx = REF_NIL;
  setmref(J->scev.pc, NULL);

  J->baseslot = 1+LJ_FR2;  /* Invoking function is at base[-1-LJ_FR2]. */
  J->base = J->slot + J->baseslot;
  J->maxslot = 0;
  J->framedepth = 0;
  J->retdepth = 0;

  J->instunroll = J->param[JIT_P_instunroll];
  J->loopunroll = J->param[JIT_P_loopunroll];
  J->tailcalled = 0;
  J->loopref = 0;

  J->bc_min = NULL;  /* Means no limit. */
  J->bc_extent = ~(MSize)0;

  /* Emit instructions for fixed references. Also triggers initial IR alloc. */
  emitir_raw(IRT(IR_BASE, IRT_PGC), J->parent, J->exitno);
  for (i = 0; i <= 2; i++) {
    IRIns *ir = IR(REF_NIL-i);
    ir->i = 0;
    ir->t.irt = (uint8_t)(IRT_NIL+i);
    ir->o = IR_KPRI;
    ir->prev = 0;
  }
  J->cur.nk = REF_TRUE;

  J->startpc = J->pc;
  setmref(J->cur.startpc, J->pc);
  if (J->parent) {  /* Side trace. */
    GCtrace *T = traceref(J, J->parent);
    TraceNo root = T->root ? T->root : J->parent;
    J->cur.root = (uint16_t)root;
    J->cur.startins = BCINS_AD(BC_JMP, 0, 0);
    /* Check whether we could at least potentially form an extra loop. */
    if (J->exitno == 0 && T->snap[0].nent == 0) {
      /* We can narrow a FORL for some side traces, too. */
      if (J->pc > proto_bc(J->pt) && bc_op(J->pc[-1]) == BC_JFORI &&
	  bc_d(J->pc[bc_j(J->pc[-1])-1]) == root) {
	lj_snap_add(J);
	rec_for_loop(J, J->pc-1, &J->scev, 1);
	goto sidecheck;
      }
    } else {
      J->startpc = NULL;  /* Prevent forming an extra loop. */
    }
    lj_snap_replay(J, T);
  sidecheck:
    if ((traceref(J, J->cur.root)->nchild >= J->param[JIT_P_maxside] ||
	 T->snap[J->exitno].count >= J->param[JIT_P_hotexit] +
				     J->param[JIT_P_tryside])) {
      if (bc_op(*J->pc) == BC_JLOOP) {
	BCIns startins = traceref(J, bc_d(*J->pc))->startins;
	if (bc_op(startins) == BC_ITERN)
	  rec_itern(J, bc_a(startins), bc_b(startins));
      }
      lj_record_stop(J, LJ_TRLINK_INTERP, 0);
    }
  } else {  /* Root trace. */
    J->cur.root = 0;
    J->cur.startins = *J->pc;
    J->pc = rec_setup_root(J);
    /* Note: the loop instruction itself is recorded at the end and not
    ** at the start! So snapshot #0 needs to point to the *next* instruction.
    ** The one exception is BC_ITERN, which sets LJ_TRACE_RECORD_1ST.
    */
    lj_snap_add(J);
    if (bc_op(J->cur.startins) == BC_FORL)
      rec_for_loop(J, J->pc-1, &J->scev, 1);
    else if (bc_op(J->cur.startins) == BC_ITERC)
      J->startpc = NULL;
    if (1 + J->pt->framesize >= LJ_MAX_JSLOTS)
      lj_trace_err(J, LJ_TRERR_STACKOV);
  }
#if LJ_HASPROFILE
  J->prev_pt = NULL;
  J->prev_line = -1;
#endif
#ifdef LUAJIT_ENABLE_CHECKHOOK
  /* Regularly check for instruction/line hooks from compiled code and
  ** exit to the interpreter if the hooks are set.
  **
  ** This is a compile-time option and disabled by default, since the
  ** hook checks may be quite expensive in tight loops.
  **
  ** Note this is only useful if hooks are *not* set most of the time.
  ** Use this only if you want to *asynchronously* interrupt the execution.
  **
  ** You can set the instruction hook via lua_sethook() with a count of 1
  ** from a signal handler or another native thread. Please have a look
  ** at the first few functions in luajit.c for an example (Ctrl-C handler).
  */
  {
    TRef tr = emitir(IRT(IR_XLOAD, IRT_U8),
		     lj_ir_kptr(J, &J2G(J)->hookmask), IRXLOAD_VOLATILE);
    tr = emitir(IRTI(IR_BAND), tr, lj_ir_kint(J, (LUA_MASKLINE|LUA_MASKCOUNT)));
    emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, 0));
  }
#endif
}